

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityMarking.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::EntityMarking::EntityMarking
          (EntityMarking *this,EntityMarkingCharacterSet MarkingCharSet,KCHAR8 *MarkingText,
          KUINT16 TextSize)

{
  KException *this_00;
  allocator<char> local_49;
  KString local_48;
  ushort local_22;
  KCHAR8 *pKStack_20;
  KUINT16 TextSize_local;
  KCHAR8 *MarkingText_local;
  EntityMarking *pEStack_10;
  EntityMarkingCharacterSet MarkingCharSet_local;
  EntityMarking *this_local;
  
  local_22 = TextSize;
  pKStack_20 = MarkingText;
  MarkingText_local._4_4_ = MarkingCharSet;
  pEStack_10 = this;
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__EntityMarking_00331c08;
  this->m_ui8EntityMarkingCharacterSet = (KUINT8)MarkingText_local._4_4_;
  if (0xb < local_22) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"EntityMarking",&local_49);
    KException::KException(this_00,&local_48,3);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  this->m_sEntityMarkingString[8] = '\0';
  this->m_sEntityMarkingString[9] = '\0';
  this->m_sEntityMarkingString[10] = '\0';
  this->m_sEntityMarkingString[0xb] = '\0';
  this->m_sEntityMarkingString[0] = '\0';
  this->m_sEntityMarkingString[1] = '\0';
  this->m_sEntityMarkingString[2] = '\0';
  this->m_sEntityMarkingString[3] = '\0';
  this->m_sEntityMarkingString[4] = '\0';
  this->m_sEntityMarkingString[5] = '\0';
  this->m_sEntityMarkingString[6] = '\0';
  this->m_sEntityMarkingString[7] = '\0';
  SetEntityMarkingString(this,pKStack_20,local_22);
  return;
}

Assistant:

EntityMarking::EntityMarking(EntityMarkingCharacterSet MarkingCharSet, const KCHAR8 *MarkingText,
                             KUINT16 TextSize) noexcept(false) :
    m_ui8EntityMarkingCharacterSet( MarkingCharSet )
{
    if( TextSize > 11 )throw KException( __FUNCTION__, STRING_PDU_SIZE_TOO_BIG );

    memset( m_sEntityMarkingString, 0x00, sizeof( m_sEntityMarkingString ) );
    SetEntityMarkingString( MarkingText, TextSize );
}